

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O2

void __thiscall
Hand::getFingers(Hand *this,vector<ShortFinger,_std::allocator<ShortFinger>_> *lastFingers)

{
  vector<Finger,_std::allocator<Finger>_> *this_00;
  pointer pVVar1;
  pointer pFVar2;
  pointer pFVar3;
  Finger *pFVar4;
  Finger *pFVar5;
  bool bVar6;
  ulong uVar7;
  Finger *pFVar8;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> __i;
  pointer pFVar9;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> _Var10;
  int iVar11;
  size_type __new_size;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> __it;
  Vec4i *v;
  pointer defect;
  long lVar12;
  long lVar13;
  Finger f;
  _InputArray local_a0;
  Finger local_88;
  _OutputArray local_48;
  
  if ((this->contour).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
      .super__Vector_impl_data._M_start ==
      (this->contour).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    this->ok = false;
  }
  else {
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_a0.sz.width = 0;
    local_a0.sz.height = 0;
    local_a0.obj = &this->hull;
    local_a0.flags = -0x7dfcfff4;
    f.ptEnd = (Point)this;
    cv::convexHull((_InputArray *)&f,(_OutputArray *)&local_a0,false,true);
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_a0.sz.width = 0;
    local_a0.sz.height = 0;
    local_a0.flags = -0x7dfcfffc;
    f.ptEnd = (Point)this;
    local_a0.obj = &this->hullI;
    cv::convexHull((_InputArray *)&f,(_OutputArray *)&local_a0,false,true);
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_a0.sz.width = 0;
    local_a0.sz.height = 0;
    local_a0.flags = -0x7efcfffc;
    local_48.super__InputArray.sz.width = 0;
    local_48.super__InputArray.sz.height = 0;
    local_48.super__InputArray.obj = &this->defects;
    local_48.super__InputArray.flags = -0x7dfcffe4;
    f.ptEnd = (Point)this;
    local_a0.obj = &this->hullI;
    cv::convexityDefects((_InputArray *)&f,&local_a0,&local_48);
    pVVar1 = (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = &this->fingers;
    for (defect = (this->defects).
                  super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl.
                  super__Vector_impl_data._M_start; defect != pVVar1; defect = defect + 1) {
      Finger::Finger(&f,defect,&this->contour,&this->border,this->maxAngle,this->shouldCheckAngles,
                     true,-1);
      if (f.ok == true) {
        std::vector<Finger,_std::allocator<Finger>_>::push_back(this_00,&f);
      }
    }
    pFVar2 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar3 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar2 != pFVar3) {
      uVar7 = (long)pFVar3 - (long)pFVar2 >> 6;
      lVar13 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                (pFVar2,pFVar3,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pFVar3 - (long)pFVar2 < 0x401) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                  (pFVar2,pFVar3);
      }
      else {
        pFVar9 = pFVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                  (pFVar2,pFVar9);
        for (; pFVar9 != pFVar3; pFVar9 = pFVar9 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Val_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                    (pFVar9);
        }
      }
    }
    removeCloseFingertips(this);
    getCenter(this);
    getFingersIndexes(this,lastFingers);
    iVar11 = this->maxFingers;
    __new_size = (size_type)iVar11;
    if (__new_size != 0xffffffffffffffff) {
      if (__new_size <
          (ulong)((long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6)) {
        std::vector<Finger,_std::allocator<Finger>_>::resize(this_00,__new_size);
        iVar11 = this->maxFingers;
      }
      if ((iVar11 != -1 & this->shouldGetLast) == 1) {
        pFVar8 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pFVar4 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((ulong)((long)pFVar4 - (long)pFVar8 >> 6) < (ulong)(long)iVar11) {
          for (; pFVar8 != pFVar4; pFVar8 = pFVar8 + 1) {
            __it._M_current =
                 (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                 super__Vector_impl_data._M_start;
            pFVar5 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar13 = (long)pFVar5 - (long)__it._M_current;
            if (((long)this->maxFingers != 0xffffffffffffffff) &&
               ((ulong)(long)this->maxFingers <= (ulong)(lVar13 >> 6))) {
              return;
            }
            Finger::Finger(&local_88,pFVar8);
            f.ptStart = local_88.ptStart;
            f.ptEnd = local_88.ptEnd;
            f.ptFar = local_88.ptFar;
            f.index = local_88.index;
            f.hndAngle = local_88.hndAngle;
            f.depth = local_88.depth;
            f.maxAngle = local_88.maxAngle;
            f.minDepth = local_88.minDepth;
            f.ok = local_88.ok;
            f.shouldCheckAngles = local_88.shouldCheckAngles;
            f.shouldCheckDist = local_88.shouldCheckDist;
            f._39_1_ = local_88._39_1_;
            f.boundingBox.x = local_88.boundingBox.x;
            f.boundingBox.y = local_88.boundingBox.y;
            f.boundingBox.width = local_88.boundingBox.width;
            f.boundingBox.height = local_88.boundingBox.height;
            for (lVar12 = lVar13 >> 8; _Var10._M_current = __it._M_current, 0 < lVar12;
                lVar12 = lVar12 + -1) {
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::$_1>
                      ::operator()((_Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                                    *)&f,__it);
              if (bVar6) goto LAB_00105858;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::$_1>
                      ::operator()((_Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                                    *)&f,__it._M_current + 1);
              _Var10._M_current = __it._M_current + 1;
              if (bVar6) goto LAB_00105858;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::$_1>
                      ::operator()((_Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                                    *)&f,__it._M_current + 2);
              _Var10._M_current = __it._M_current + 2;
              if (bVar6) goto LAB_00105858;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::$_1>
                      ::operator()((_Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                                    *)&f,__it._M_current + 3);
              _Var10._M_current = __it._M_current + 3;
              if (bVar6) goto LAB_00105858;
              __it._M_current = __it._M_current + 4;
              lVar13 = lVar13 + -0x100;
            }
            lVar13 = lVar13 >> 6;
            if (lVar13 == 1) {
LAB_001058a1:
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::$_1>
                      ::operator()((_Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                                    *)&f,__it);
              _Var10._M_current = pFVar5;
              if (bVar6) {
                _Var10._M_current = __it._M_current;
              }
            }
            else if (lVar13 == 2) {
LAB_00105835:
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::$_1>
                      ::operator()((_Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                                    *)&f,_Var10);
              if (!bVar6) {
                __it._M_current = _Var10._M_current + 1;
                goto LAB_001058a1;
              }
            }
            else {
              _Var10._M_current = pFVar5;
              if ((lVar13 == 3) &&
                 (bVar6 = __gnu_cxx::__ops::
                          _Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::$_1>
                          ::operator()((_Iter_pred<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                                        *)&f,__it), _Var10._M_current = __it._M_current, !bVar6)) {
                _Var10._M_current = __it._M_current + 1;
                goto LAB_00105835;
              }
            }
LAB_00105858:
            if (_Var10._M_current ==
                (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              Finger::Finger(&f,pFVar8);
              f.ptStart = pFVar8->ptEnd;
              f.ptEnd = pFVar8->ptStart;
              f.index = -1;
              std::vector<Finger,std::allocator<Finger>>::emplace_back<Finger&>
                        ((vector<Finger,std::allocator<Finger>> *)this_00,&f);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Hand::getFingers(const vector<ShortFinger> &lastFingers) {
    if (contour.empty()) {
        ok = false;
        return;
    }
    convexHull(contour, hull, false);
    convexHull(contour, hullI, false);
    convexityDefects(contour, hullI, defects);

    for (const Vec4i &v : defects) {
        Finger f(v, contour, border, maxAngle, shouldCheckAngles);
        if (f.ok)
            fingers.push_back(f);
    }
    sort(fingers.begin(), fingers.end(), [](const Finger &a, const Finger &b) {
        return a.ptStart.y < b.ptStart.y;
    });
    removeCloseFingertips();
    getCenter();
    getFingersIndexes(lastFingers);
    if (maxFingers != -1 && fingers.size() > maxFingers)
        fingers.resize(maxFingers);

    if (shouldGetLast) {
        if (maxFingers != -1 && fingers.size() < maxFingers) {
            for (const Finger &f : fingers) {
                if (maxFingers != -1 && fingers.size() >= maxFingers)
                    break;
                auto fnd = find_if(fingers.begin(), fingers.end(), [f](const Finger &b) {
                    return getDist(f.ptEnd, b.ptStart) <= 50;
                });
                if (fnd != fingers.end())
                    continue;

                Finger nf = f;
                nf.ptStart = f.ptEnd;
                nf.ptEnd = f.ptStart;
                nf.index = -1;
                fingers.emplace_back(nf);
            }
        }
    }
}